

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

uint64_t __thiscall cfd::core::Deserializer::ReadVariableInt(Deserializer *this)

{
  uchar *puVar1;
  byte *pbVar2;
  uint64_t num_2;
  uint32_t num_1;
  uint16_t num;
  uint64_t value;
  uint8_t *buf;
  Deserializer *this_local;
  
  CheckReadSize(this,1);
  puVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3e7c7b);
  pbVar2 = puVar1 + this->offset_;
  if (*pbVar2 < 0xfd) {
    _num_1 = (uint64_t)*pbVar2;
    this->offset_ = this->offset_ + 1;
  }
  else if (*pbVar2 == 0xfd) {
    CheckReadSize(this,3);
    _num_1 = (uint64_t)*(ushort *)(pbVar2 + 1);
    this->offset_ = this->offset_ + 3;
  }
  else if (*pbVar2 == 0xfe) {
    CheckReadSize(this,5);
    _num_1 = (uint64_t)*(uint *)(pbVar2 + 1);
    this->offset_ = this->offset_ + 5;
  }
  else {
    CheckReadSize(this,9);
    _num_1 = *(uint64_t *)(pbVar2 + 1);
    this->offset_ = this->offset_ + 9;
  }
  return _num_1;
}

Assistant:

uint64_t Deserializer::ReadVariableInt() {
  CheckReadSize(1);
  const uint8_t* buf = buffer_.data() + offset_;
  uint64_t value = 0;
  if (*buf <= Serializer::kViMax8) {
    value = *buf;
    offset_ += 1;
  } else if (*buf == Serializer::kViTag16) {
    CheckReadSize(3);
    ++buf;
    uint16_t num;
    memcpy(&num, buf, sizeof(num));
    value = num;
    offset_ += 1 + sizeof(num);
  } else if (*buf == Serializer::kViTag32) {
    CheckReadSize(5);
    ++buf;
    uint32_t num;
    memcpy(&num, buf, sizeof(num));
    value = num;
    offset_ += 1 + sizeof(num);
  } else {
    CheckReadSize(9);
    ++buf;
    uint64_t num;
    memcpy(&num, buf, sizeof(num));
    value = num;
    offset_ += 1 + sizeof(num);
  }
  return value;
}